

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftRigidDynamicsWorld.cpp
# Opt level: O0

void __thiscall
btSoftRigidDynamicsWorld::serializeSoftBodies
          (btSoftRigidDynamicsWorld *this,btSerializer *serializer)

{
  btCollisionObject *this_00;
  int iVar1;
  uint uVar2;
  btCollisionObject **ppbVar3;
  long lVar4;
  long *in_RSI;
  long in_RDI;
  char *structType;
  btChunk *chunk;
  int len;
  btCollisionObject *colObj;
  int i;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    iVar1 = btAlignedObjectArray<btCollisionObject_*>::size
                      ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 8));
    if (iVar1 <= local_14) break;
    ppbVar3 = btAlignedObjectArray<btCollisionObject_*>::operator[]
                        ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 8),local_14);
    this_00 = *ppbVar3;
    uVar2 = btCollisionObject::getInternalType(this_00);
    if ((uVar2 & 8) != 0) {
      iVar1 = (*this_00->_vptr_btCollisionObject[4])();
      lVar4 = (**(code **)(*in_RSI + 0x20))(in_RSI,(long)iVar1,1);
      iVar1 = (*this_00->_vptr_btCollisionObject[5])(this_00,*(undefined8 *)(lVar4 + 8),in_RSI);
      (**(code **)(*in_RSI + 0x28))(in_RSI,lVar4,iVar1,0x59444253,this_00);
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void	btSoftRigidDynamicsWorld::serializeSoftBodies(btSerializer* serializer)
{
	int i;
	//serialize all collision objects
	for (i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject* colObj = m_collisionObjects[i];
		if (colObj->getInternalType() & btCollisionObject::CO_SOFT_BODY)
		{
			int len = colObj->calculateSerializeBufferSize();
			btChunk* chunk = serializer->allocate(len,1);
			const char* structType = colObj->serialize(chunk->m_oldPtr, serializer);
			serializer->finalizeChunk(chunk,structType,BT_SOFTBODY_CODE,colObj);
		}
	}

}